

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::Arg::commands_abi_cxx11_
          (string *__return_storage_ptr__,Arg *this)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pbVar4;
  ostringstream oss;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pbVar1 = (this->super_OptionArgProperties).shortNames.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (pbVar4 = (this->super_OptionArgProperties).shortNames.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if (bVar2) {
      bVar2 = false;
    }
    else {
      std::operator<<((ostream *)local_1a8,", ");
    }
    poVar3 = std::operator<<((ostream *)local_1a8,"-");
    std::operator<<(poVar3,(string *)pbVar4);
  }
  if ((this->super_OptionArgProperties).longName._M_string_length != 0) {
    if (!bVar2) {
      std::operator<<((ostream *)local_1a8,", ");
    }
    poVar3 = std::operator<<((ostream *)local_1a8,"--");
    std::operator<<(poVar3,(string *)&(this->super_OptionArgProperties).longName);
  }
  if ((this->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_string_length != 0) {
    poVar3 = std::operator<<((ostream *)local_1a8," <");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_CommonArgProperties<Catch::ConfigData>).
                                     placeholder);
    std::operator<<(poVar3,">");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string commands() const {
                std::ostringstream oss;
                bool first = true;
                std::vector<std::string>::const_iterator it = shortNames.begin(), itEnd = shortNames.end();
                for(; it != itEnd; ++it ) {
                    if( first )
                        first = false;
                    else
                        oss << ", ";
                    oss << "-" << *it;
                }
                if( !longName.empty() ) {
                    if( !first )
                        oss << ", ";
                    oss << "--" << longName;
                }
                if( !placeholder.empty() )
                    oss << " <" << placeholder << ">";
                return oss.str();
            }